

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall spdlog::spdlog_ex::spdlog_ex(spdlog_ex *this,string *msg,int last_errno)

{
  undefined4 error_code;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string_view local_260 [2];
  allocator<char> local_239;
  undefined1 local_238 [8];
  memory_buffer outbuf;
  int last_errno_local;
  string *msg_local;
  spdlog_ex *this_local;
  
  outbuf._532_4_ = last_errno;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__spdlog_ex_003a2d70;
  std::__cxx11::string::string((string *)&this->msg_);
  std::allocator<char>::allocator();
  ::fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_238,&local_239);
  std::allocator<char>::~allocator(&local_239);
  error_code = outbuf._532_4_;
  ::fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>(local_260,msg);
  ::fmt::v5::format_system_error((buffer *)local_238,error_code,local_260[0]);
  ::fmt::v5::to_string<char,500ul>(&local_280,(v5 *)local_238,buf);
  std::__cxx11::string::operator=((string *)&this->msg_,(string *)&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  ::fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_238);
  return;
}

Assistant:

spdlog_ex(const std::string &msg, int last_errno)
    {
        fmt::memory_buffer outbuf;
        fmt::format_system_error(outbuf, last_errno, msg);
        msg_ = fmt::to_string(outbuf);
    }